

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ProceduralBlockSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ProceduralBlockSymbol,slang::SourceLocation&,slang::ast::ProceduralBlockKind&,bool&>
          (BumpAllocator *this,SourceLocation *args,ProceduralBlockKind *args_1,bool *args_2)

{
  ProceduralBlockSymbol *pPVar1;
  size_t in_RCX;
  ProceduralBlockSymbol *in_RDX;
  SourceLocation in_RSI;
  size_t in_stack_ffffffffffffffd8;
  
  pPVar1 = (ProceduralBlockSymbol *)
           allocate((BumpAllocator *)in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  ast::ProceduralBlockSymbol::ProceduralBlockSymbol
            (in_RDX,in_RSI,(ProceduralBlockKind)(in_RCX >> 0x20),SUB81(in_RCX >> 0x18,0));
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }